

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_parse.c
# Opt level: O0

int mpt_color_parse(mpt_color *color,char *txt)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ushort **ppuVar4;
  int local_34;
  ulong local_30;
  size_t i;
  int len;
  char *txt_local;
  mpt_color *color_local;
  
  if ((txt == (char *)0x0) || (*txt == '\0')) {
    if (color != (mpt_color *)0x0) {
      mpt_color_set(color,0,0,0);
    }
    color_local._4_4_ = 0;
  }
  else if (*txt == '#') {
    local_34 = mpt_color_html(color,txt + 1);
    if (0 < local_34) {
      local_34 = local_34 + 1;
    }
    color_local._4_4_ = local_34;
  }
  else {
    for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
      sVar3 = strlen(mpt_color_parse::col[local_30].name);
      iVar1 = (int)sVar3;
      iVar2 = strncasecmp(mpt_color_parse::col[local_30].name,txt,(long)iVar1);
      if ((iVar2 == 0) &&
         ((txt[iVar1] == '\0' ||
          (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)txt[iVar1]] & 0x2000) != 0)))) {
        if (color == (mpt_color *)0x0) {
          return iVar1;
        }
        *color = mpt_color_parse::col[local_30].val;
        return iVar1;
      }
    }
    color_local._4_4_ = -2;
  }
  return color_local._4_4_;
}

Assistant:

extern int mpt_color_parse(MPT_STRUCT(color) *color, const char *txt)
{
	static const struct {
		const char *name;
		MPT_STRUCT(color) val;
	} col[] = {
		{ "black",   { 0xff, 0, 0, 0 } },
		
		{ "red",     { 0xff, 0xff, 0, 0 } },
		{ "green",   { 0xff, 0, 0xff, 0 } },
		{ "blue",    { 0xff, 0, 0, 0xff } },
		
		{ "cyan",    { 0xff, 0, 0xff, 0xff } },
		{ "magenta", { 0xff, 0xff, 0, 0xff } },
		{ "yellow",  { 0xff, 0xff, 0xff, 0 } },
		
		{ "white",   { 0xff, 0xff, 0xff, 0xff } }
	};
	int len;
	
	if (!txt || !*txt) {
		if (color) mpt_color_set(color, 0, 0, 0);
		return 0;
	}
	if (!(*txt == '#')) {
		size_t i;
		
		for (i = 0; i < MPT_arrsize(col); i++) {
			len = strlen(col[i].name);
			if (!strncasecmp(col[i].name, txt, len) && (!txt[len] || isspace(txt[len]))) {
				if (color) *color = col[i].val;
				return len;
			}
		}
		return MPT_ERROR(BadValue);
	}
	len = mpt_color_html(color, txt+1);
	
	return len > 0 ? len+1 : len;
}